

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O2

void __thiscall
rr::FragmentProcessor::executeBlendFactorComputeRGB
          (FragmentProcessor *this,Vec4 *blendColor,BlendState *blendRGBState)

{
  float fVar1;
  undefined4 uVar2;
  long lVar3;
  uint uVar4;
  float fVar5;
  Vector<float,_3> local_5c;
  Vector<float,_3> local_50;
  Vector<float,_3> local_44;
  BlendState *local_38;
  
  local_38 = blendRGBState;
  switch(blendRGBState->srcFunc) {
  case BLENDFUNC_ZERO:
    for (lVar3 = 0x34; lVar3 != 0x2134; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x38) ==
          '\x01') {
        tcu::Vector<float,_3>::Vector(&local_5c,0.0);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 4) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             local_5c.m_data._0_8_;
      }
    }
    break;
  case BLENDFUNC_ONE:
    for (lVar3 = 0x34; lVar3 != 0x2134; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x38) ==
          '\x01') {
        tcu::Vector<float,_3>::Vector(&local_5c,1.0);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 4) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             local_5c.m_data._0_8_;
      }
    }
    break;
  case BLENDFUNC_SRC_COLOR:
    for (lVar3 = 0; lVar3 != 0x2100; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) ==
          '\x01') {
        uVar2 = *(undefined4 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 8);
        *(undefined8 *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar3) =
             *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3);
        *(undefined4 *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar3 + 8) =
             uVar2;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_SRC_COLOR:
    for (lVar3 = 0; lVar3 != 0x2100; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) ==
          '\x01') {
        tcu::Vector<float,_3>::Vector(&local_44,1.0);
        local_50.m_data[2] =
             *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 8);
        local_50.m_data._0_8_ =
             *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3);
        tcu::operator-((tcu *)&local_5c,&local_44,&local_50);
        *(float *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar3 + 8) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar3) =
             local_5c.m_data._0_8_;
      }
    }
    break;
  case BLENDFUNC_DST_COLOR:
    for (lVar3 = 0x3c; lVar3 != 0x213c; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -4) + lVar3) == '\x01')
      {
        uVar2 = *(undefined4 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x14);
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0xc)
             = *(undefined8 *)
                ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x1c);
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             uVar2;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_DST_COLOR:
    for (lVar3 = 0x34; lVar3 != 0x2134; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x38) ==
          '\x01') {
        tcu::Vector<float,_3>::Vector(&local_44,1.0);
        local_50.m_data[2] =
             *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0xc);
        local_50.m_data._0_8_ =
             *(undefined8 *)
              ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x14);
        tcu::operator-((tcu *)&local_5c,&local_44,&local_50);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 4) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             local_5c.m_data._0_8_;
      }
    }
    break;
  case BLENDFUNC_SRC_ALPHA:
    for (lVar3 = 0; lVar3 != 0x2100; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) ==
          '\x01') {
        tcu::Vector<float,_3>::Vector
                  (&local_5c,
                   *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar3 + 0xc));
        *(float *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar3 + 8) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar3) =
             local_5c.m_data._0_8_;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_SRC_ALPHA:
    for (lVar3 = 0; lVar3 != 0x2100; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) ==
          '\x01') {
        tcu::Vector<float,_3>::Vector
                  (&local_5c,
                   1.0 - *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                                   lVar3 + 0xc));
        *(float *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar3 + 8) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar3) =
             local_5c.m_data._0_8_;
      }
    }
    break;
  case BLENDFUNC_DST_ALPHA:
    for (lVar3 = 0x34; lVar3 != 0x2134; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x38) ==
          '\x01') {
        tcu::Vector<float,_3>::Vector
                  (&local_5c,
                   *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar3 + -8));
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 4) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             local_5c.m_data._0_8_;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_DST_ALPHA:
    for (lVar3 = 0x34; lVar3 != 0x2134; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x38) ==
          '\x01') {
        tcu::Vector<float,_3>::Vector
                  (&local_5c,
                   1.0 - *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                                   lVar3 + -8));
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 4) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             local_5c.m_data._0_8_;
      }
    }
    break;
  case BLENDFUNC_CONSTANT_COLOR:
    for (lVar3 = 0x3c; lVar3 != 0x213c; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -4) + lVar3) == '\x01')
      {
        fVar1 = blendColor->m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0xc)
             = *(undefined8 *)blendColor->m_data;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) = fVar1
        ;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_CONSTANT_COLOR:
    for (lVar3 = 0x34; lVar3 != 0x2134; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x38) ==
          '\x01') {
        tcu::Vector<float,_3>::Vector(&local_44,1.0);
        local_50.m_data[2] = blendColor->m_data[2];
        local_50.m_data._0_8_ = *(undefined8 *)blendColor->m_data;
        tcu::operator-((tcu *)&local_5c,&local_44,&local_50);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 4) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             local_5c.m_data._0_8_;
      }
    }
    break;
  case BLENDFUNC_CONSTANT_ALPHA:
    for (lVar3 = 0x34; lVar3 != 0x2134; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x38) ==
          '\x01') {
        tcu::Vector<float,_3>::Vector(&local_5c,blendColor->m_data[3]);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 4) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             local_5c.m_data._0_8_;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_CONSTANT_ALPHA:
    for (lVar3 = 0x34; lVar3 != 0x2134; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x38) ==
          '\x01') {
        tcu::Vector<float,_3>::Vector(&local_5c,1.0 - blendColor->m_data[3]);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 4) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             local_5c.m_data._0_8_;
      }
    }
    break;
  case BLENDFUNC_SRC_ALPHA_SATURATE:
    for (lVar3 = 0x34; lVar3 != 0x2134; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x38) ==
          '\x01') {
        fVar1 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                          lVar3 + -0x28);
        fVar5 = 1.0 - *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                                lVar3 + -8);
        uVar4 = -(uint)(fVar1 <= fVar5);
        tcu::Vector<float,_3>::Vector(&local_5c,(float)(uVar4 & (uint)fVar1 | ~uVar4 & (uint)fVar5))
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 4) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             local_5c.m_data._0_8_;
      }
    }
    break;
  case BLENDFUNC_SRC1_COLOR:
    for (lVar3 = 0x3c; lVar3 != 0x213c; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -4) + lVar3) == '\x01')
      {
        uVar2 = *(undefined4 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x24);
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0xc)
             = *(undefined8 *)
                ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x2c);
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             uVar2;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_SRC1_COLOR:
    for (lVar3 = 0x34; lVar3 != 0x2134; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x38) ==
          '\x01') {
        tcu::Vector<float,_3>::Vector(&local_44,1.0);
        local_50.m_data[2] =
             *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x1c)
        ;
        local_50.m_data._0_8_ =
             *(undefined8 *)
              ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x24);
        tcu::operator-((tcu *)&local_5c,&local_44,&local_50);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 4) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             local_5c.m_data._0_8_;
      }
    }
    break;
  case BLENDFUNC_SRC1_ALPHA:
    for (lVar3 = 0x34; lVar3 != 0x2134; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x38) ==
          '\x01') {
        tcu::Vector<float,_3>::Vector
                  (&local_5c,
                   *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar3 + -0x18));
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 4) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             local_5c.m_data._0_8_;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_SRC1_ALPHA:
    for (lVar3 = 0x34; lVar3 != 0x2134; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x38) ==
          '\x01') {
        tcu::Vector<float,_3>::Vector
                  (&local_5c,
                   1.0 - *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                                   lVar3 + -0x18));
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 4) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             local_5c.m_data._0_8_;
      }
    }
  }
  switch(local_38->dstFunc) {
  case BLENDFUNC_ZERO:
    for (lVar3 = 0x44; lVar3 != 0x2144; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x48) ==
          '\x01') {
        tcu::Vector<float,_3>::Vector(&local_5c,0.0);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 4) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             local_5c.m_data._0_8_;
      }
    }
    break;
  case BLENDFUNC_ONE:
    for (lVar3 = 0x44; lVar3 != 0x2144; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x48) ==
          '\x01') {
        tcu::Vector<float,_3>::Vector(&local_5c,1.0);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 4) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             local_5c.m_data._0_8_;
      }
    }
    break;
  case BLENDFUNC_SRC_COLOR:
    for (lVar3 = 0; lVar3 != 0x2100; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) ==
          '\x01') {
        uVar2 = *(undefined4 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 8);
        *(undefined8 *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar3) =
             *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3);
        *(undefined4 *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar3 + 8) =
             uVar2;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_SRC_COLOR:
    for (lVar3 = 0; lVar3 != 0x2100; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) ==
          '\x01') {
        tcu::Vector<float,_3>::Vector(&local_44,1.0);
        local_50.m_data[2] =
             *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 8);
        local_50.m_data._0_8_ =
             *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3);
        tcu::operator-((tcu *)&local_5c,&local_44,&local_50);
        *(float *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar3 + 8) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar3) =
             local_5c.m_data._0_8_;
      }
    }
    break;
  case BLENDFUNC_DST_COLOR:
    for (lVar3 = 0x4c; lVar3 != 0x214c; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -5) + lVar3) == '\x01')
      {
        uVar2 = *(undefined4 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x24);
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0xc)
             = *(undefined8 *)
                ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x2c);
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             uVar2;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_DST_COLOR:
    for (lVar3 = 0x44; lVar3 != 0x2144; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x48) ==
          '\x01') {
        tcu::Vector<float,_3>::Vector(&local_44,1.0);
        local_50.m_data[2] =
             *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x1c)
        ;
        local_50.m_data._0_8_ =
             *(undefined8 *)
              ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x24);
        tcu::operator-((tcu *)&local_5c,&local_44,&local_50);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 4) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             local_5c.m_data._0_8_;
      }
    }
    break;
  case BLENDFUNC_SRC_ALPHA:
    for (lVar3 = 0; lVar3 != 0x2100; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) ==
          '\x01') {
        tcu::Vector<float,_3>::Vector
                  (&local_5c,
                   *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar3 + 0xc));
        *(float *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar3 + 8) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar3) =
             local_5c.m_data._0_8_;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_SRC_ALPHA:
    for (lVar3 = 0; lVar3 != 0x2100; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) ==
          '\x01') {
        tcu::Vector<float,_3>::Vector
                  (&local_5c,
                   1.0 - *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                                   lVar3 + 0xc));
        *(float *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar3 + 8) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar3) =
             local_5c.m_data._0_8_;
      }
    }
    break;
  case BLENDFUNC_DST_ALPHA:
    for (lVar3 = 0x44; lVar3 != 0x2144; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x48) ==
          '\x01') {
        tcu::Vector<float,_3>::Vector
                  (&local_5c,
                   *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar3 + -0x18));
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 4) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             local_5c.m_data._0_8_;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_DST_ALPHA:
    for (lVar3 = 0x44; lVar3 != 0x2144; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x48) ==
          '\x01') {
        tcu::Vector<float,_3>::Vector
                  (&local_5c,
                   1.0 - *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                                   lVar3 + -0x18));
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 4) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             local_5c.m_data._0_8_;
      }
    }
    break;
  case BLENDFUNC_CONSTANT_COLOR:
    for (lVar3 = 0x4c; lVar3 != 0x214c; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -5) + lVar3) == '\x01')
      {
        fVar1 = blendColor->m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0xc)
             = *(undefined8 *)blendColor->m_data;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) = fVar1
        ;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_CONSTANT_COLOR:
    for (lVar3 = 0x44; lVar3 != 0x2144; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x48) ==
          '\x01') {
        tcu::Vector<float,_3>::Vector(&local_44,1.0);
        local_50.m_data[2] = blendColor->m_data[2];
        local_50.m_data._0_8_ = *(undefined8 *)blendColor->m_data;
        tcu::operator-((tcu *)&local_5c,&local_44,&local_50);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 4) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             local_5c.m_data._0_8_;
      }
    }
    break;
  case BLENDFUNC_CONSTANT_ALPHA:
    for (lVar3 = 0x44; lVar3 != 0x2144; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x48) ==
          '\x01') {
        tcu::Vector<float,_3>::Vector(&local_5c,blendColor->m_data[3]);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 4) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             local_5c.m_data._0_8_;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_CONSTANT_ALPHA:
    for (lVar3 = 0x44; lVar3 != 0x2144; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x48) ==
          '\x01') {
        tcu::Vector<float,_3>::Vector(&local_5c,1.0 - blendColor->m_data[3]);
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 4) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             local_5c.m_data._0_8_;
      }
    }
    break;
  case BLENDFUNC_SRC_ALPHA_SATURATE:
    for (lVar3 = 0x44; lVar3 != 0x2144; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x48) ==
          '\x01') {
        fVar1 = *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                          lVar3 + -0x38);
        fVar5 = 1.0 - *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                                lVar3 + -0x18);
        uVar4 = -(uint)(fVar1 <= fVar5);
        tcu::Vector<float,_3>::Vector(&local_5c,(float)(uVar4 & (uint)fVar1 | ~uVar4 & (uint)fVar5))
        ;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 4) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             local_5c.m_data._0_8_;
      }
    }
    break;
  case BLENDFUNC_SRC1_COLOR:
    for (lVar3 = 0x4c; lVar3 != 0x214c; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -5) + lVar3) == '\x01')
      {
        uVar2 = *(undefined4 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x34);
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0xc)
             = *(undefined8 *)
                ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x3c);
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             uVar2;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_SRC1_COLOR:
    for (lVar3 = 0; lVar3 != 0x2100; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) ==
          '\x01') {
        tcu::Vector<float,_3>::Vector(&local_44,1.0);
        local_50.m_data[2] =
             *(float *)((long)this->m_sampleRegister[0].clampedBlendSrc1Color.m_data + lVar3 + 8);
        local_50.m_data._0_8_ =
             *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrc1Color.m_data + lVar3);
        tcu::operator-((tcu *)&local_5c,&local_44,&local_50);
        *(float *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar3 + 8) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar3) =
             local_5c.m_data._0_8_;
      }
    }
    break;
  case BLENDFUNC_SRC1_ALPHA:
    for (lVar3 = 0x44; lVar3 != 0x2144; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x48) ==
          '\x01') {
        tcu::Vector<float,_3>::Vector
                  (&local_5c,
                   *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                             lVar3 + -0x28));
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 4) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             local_5c.m_data._0_8_;
      }
    }
    break;
  case BLENDFUNC_ONE_MINUS_SRC1_ALPHA:
    for (lVar3 = 0x44; lVar3 != 0x2144; lVar3 = lVar3 + 0x84) {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x48) ==
          '\x01') {
        tcu::Vector<float,_3>::Vector
                  (&local_5c,
                   1.0 - *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data +
                                   lVar3 + -0x28));
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 4) =
             local_5c.m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             local_5c.m_data._0_8_;
      }
    }
  }
  return;
}

Assistant:

void FragmentProcessor::executeBlendFactorComputeRGB (const Vec4& blendColor, const BlendState& blendRGBState)
{
#define SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, FACTOR_EXPRESSION)																				\
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)																	\
	{																																				\
		if (m_sampleRegister[regSampleNdx].isAlive)																									\
		{																																			\
			const Vec4& src		= m_sampleRegister[regSampleNdx].clampedBlendSrcColor;																\
			const Vec4& src1	= m_sampleRegister[regSampleNdx].clampedBlendSrc1Color;																\
			const Vec4& dst		= m_sampleRegister[regSampleNdx].clampedBlendDstColor;																\
			DE_UNREF(src);																															\
			DE_UNREF(src1);																															\
			DE_UNREF(dst);																															\
																																					\
			m_sampleRegister[regSampleNdx].FACTOR_NAME = (FACTOR_EXPRESSION);																		\
		}																																			\
	}

#define SWITCH_SRC_OR_DST_FACTOR_RGB(FUNC_NAME, FACTOR_NAME)																					\
	switch (blendRGBState.FUNC_NAME)																											\
	{																																			\
		case BLENDFUNC_ZERO:						SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(0.0f))								break;	\
		case BLENDFUNC_ONE:							SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f))								break;	\
		case BLENDFUNC_SRC_COLOR:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, src.swizzle(0,1,2))						break;	\
		case BLENDFUNC_ONE_MINUS_SRC_COLOR:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f) - src.swizzle(0,1,2))			break;	\
		case BLENDFUNC_DST_COLOR:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, dst.swizzle(0,1,2))						break;	\
		case BLENDFUNC_ONE_MINUS_DST_COLOR:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f) - dst.swizzle(0,1,2))			break;	\
		case BLENDFUNC_SRC_ALPHA:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(src.w()))							break;	\
		case BLENDFUNC_ONE_MINUS_SRC_ALPHA:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f - src.w()))						break;	\
		case BLENDFUNC_DST_ALPHA:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(dst.w()))							break;	\
		case BLENDFUNC_ONE_MINUS_DST_ALPHA:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f - dst.w()))						break;	\
		case BLENDFUNC_CONSTANT_COLOR:				SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, blendColor.swizzle(0,1,2))				break;	\
		case BLENDFUNC_ONE_MINUS_CONSTANT_COLOR:	SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f) - blendColor.swizzle(0,1,2))	break;	\
		case BLENDFUNC_CONSTANT_ALPHA:				SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(blendColor.w()))						break;	\
		case BLENDFUNC_ONE_MINUS_CONSTANT_ALPHA:	SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f - blendColor.w()))				break;	\
		case BLENDFUNC_SRC_ALPHA_SATURATE:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(de::min(src.w(), 1.0f - dst.w())))	break;	\
		case BLENDFUNC_SRC1_COLOR:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, src1.swizzle(0,1,2))						break;	\
		case BLENDFUNC_ONE_MINUS_SRC1_COLOR:		SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f) - src1.swizzle(0,1,2))			break;	\
		case BLENDFUNC_SRC1_ALPHA:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(src1.w()))							break;	\
		case BLENDFUNC_ONE_MINUS_SRC1_ALPHA:		SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f - src1.w()))					break;	\
		default:																																\
			DE_ASSERT(false);																													\
	}

	SWITCH_SRC_OR_DST_FACTOR_RGB(srcFunc, blendSrcFactorRGB)
	SWITCH_SRC_OR_DST_FACTOR_RGB(dstFunc, blendDstFactorRGB)

#undef SWITCH_SRC_OR_DST_FACTOR_RGB
#undef SAMPLE_REGISTER_BLEND_FACTOR
}